

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blenders_intel.cpp
# Opt level: O0

void __thiscall
agge::simd::blender_solid_color::blender_solid_color
          (blender_solid_color *this,pixel components,uint8_t alpha)

{
  longlong extraout_XMM0_Qa;
  longlong extraout_XMM0_Qa_00;
  longlong extraout_XMM0_Qb;
  longlong extraout_XMM0_Qb_00;
  uint8_t alpha_local;
  blender_solid_color *this_local;
  pixel components_local;
  
  anon_unknown_1::make_color_u16((pixel32)components.components);
  this->_color_u16[0] = extraout_XMM0_Qa;
  this->_color_u16[1] = extraout_XMM0_Qb;
  anon_unknown_1::make_alpha_u16((uint)alpha);
  this->_alpha_u16[0] = extraout_XMM0_Qa_00;
  this->_alpha_u16[1] = extraout_XMM0_Qb_00;
  *&(this->_components).components = components.components;
  return;
}

Assistant:

blender_solid_color::blender_solid_color(pixel components, uint8_t alpha)
			: _color_u16(make_color_u16(components)), _alpha_u16(make_alpha_u16(alpha)), _components(components)
		{	}